

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O2

vector<wallet::WalletDestination,_std::allocator<wallet::WalletDestination>_> * __thiscall
wallet::LegacyScriptPubKeyMan::MarkUnusedAddresses
          (vector<wallet::WalletDestination,_std::allocator<wallet::WalletDestination>_>
           *__return_storage_ptr__,LegacyScriptPubKeyMan *this,CScript *script)

{
  CKeyID seed_id;
  pointer pCVar1;
  bool bVar2;
  int iVar3;
  iterator iVar4;
  iterator iVar5;
  long *plVar6;
  pointer __k;
  pointer pCVar7;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock5;
  CKeyMetadata meta;
  vector<unsigned_int,_std::allocator<unsigned_int>_> path;
  _Vector_base<wallet::CKeyPool,_std::allocator<wallet::CKeyPool>_> local_138;
  _Vector_base<CKeyID,_std::allocator<CKeyID>_> local_120;
  unique_lock<std::recursive_mutex> local_108;
  CKeyMetadata local_f8;
  _Variadic_union<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  local_88;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&local_108,
             &(this->super_LegacyDataSPKM).super_FillableSigningProvider.cs_KeyStore,"cs_KeyStore",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
             ,0x15f,false);
  (__return_storage_ptr__->
  super__Vector_base<wallet::WalletDestination,_std::allocator<wallet::WalletDestination>_>)._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<wallet::WalletDestination,_std::allocator<wallet::WalletDestination>_>)._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<wallet::WalletDestination,_std::allocator<wallet::WalletDestination>_>)._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  GetAffectedKeys((vector<CKeyID,_std::allocator<CKeyID>_> *)&local_120,script,
                  &(this->super_LegacyDataSPKM).super_FillableSigningProvider.super_SigningProvider)
  ;
  for (__k = local_120._M_impl.super__Vector_impl_data._M_start;
      __k != local_120._M_impl.super__Vector_impl_data._M_finish; __k = __k + 1) {
    iVar4 = std::
            _Rb_tree<CKeyID,_std::pair<const_CKeyID,_long>,_std::_Select1st<std::pair<const_CKeyID,_long>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_long>_>_>
            ::find(&(this->super_LegacyDataSPKM).m_pool_key_to_index._M_t,__k);
    if ((_Rb_tree_header *)iVar4._M_node !=
        &(this->super_LegacyDataSPKM).m_pool_key_to_index._M_t._M_impl.super__Rb_tree_header) {
      ScriptPubKeyMan::WalletLogPrintf<char[20]>
                ((ScriptPubKeyMan *)this,(ConstevalFormatString<1U>)0x3f811b,
                 (char (*) [20])"MarkUnusedAddresses");
      MarkReserveKeysAsUsed
                ((vector<wallet::CKeyPool,_std::allocator<wallet::CKeyPool>_> *)&local_138,this,
                 (int64_t)iVar4._M_node[1]._M_right);
      pCVar1 = local_138._M_impl.super__Vector_impl_data._M_finish;
      for (pCVar7 = local_138._M_impl.super__Vector_impl_data._M_start; pCVar7 != pCVar1;
          pCVar7 = pCVar7 + 1) {
        plVar6 = (long *)(wallet::LEGACY_OUTPUT_TYPES + 0x10);
        while (plVar6 = (long *)*plVar6, plVar6 != (long *)0x0) {
          GetDestinationForKey
                    ((CTxDestination *)&local_88._M_first,&pCVar7->vchPubKey,
                     *(OutputType *)(plVar6 + 1));
          std::__detail::__variant::
          _Copy_ctor_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
          ::_Copy_ctor_base((_Copy_ctor_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                             *)&local_f8,
                            (_Copy_ctor_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                             *)&local_88._M_first);
          local_f8.key_origin.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_start._0_1_ = pCVar7->fInternal;
          local_f8.key_origin.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_start._1_1_ = 1;
          std::vector<wallet::WalletDestination,_std::allocator<wallet::WalletDestination>_>::
          emplace_back<wallet::WalletDestination>
                    (__return_storage_ptr__,(WalletDestination *)&local_f8);
          std::__detail::__variant::
          _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
          ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                               *)&local_f8);
          std::__detail::__variant::
          _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
          ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                               *)&local_88._M_first);
        }
      }
      std::_Vector_base<wallet::CKeyPool,_std::allocator<wallet::CKeyPool>_>::~_Vector_base
                (&local_138);
      iVar3 = (*(this->super_LegacyDataSPKM).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan[9])(this,0)
      ;
      if ((char)iVar3 == '\0') {
        ScriptPubKeyMan::WalletLogPrintf<char[20]>
                  ((ScriptPubKeyMan *)this,(ConstevalFormatString<1U>)0x3f817e,
                   (char (*) [20])"MarkUnusedAddresses");
      }
    }
    iVar5 = std::
            _Rb_tree<CKeyID,_std::pair<const_CKeyID,_wallet::CKeyMetadata>,_std::_Select1st<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>_>
            ::find(&(this->super_LegacyDataSPKM).mapKeyMetadata._M_t,__k);
    if ((_Rb_tree_header *)iVar5._M_node !=
        &(this->super_LegacyDataSPKM).mapKeyMetadata._M_t._M_impl.super__Rb_tree_header) {
      CKeyMetadata::CKeyMetadata(&local_f8,(CKeyMetadata *)&iVar5._M_node[1]._M_right);
      bVar2 = base_blob<160U>::IsNull((base_blob<160U> *)&local_f8.hd_seed_id);
      if (!bVar2) {
        bVar2 = operator!=((base_blob<160U> *)&local_f8.hd_seed_id,
                           (base_blob<160U> *)&(this->super_LegacyDataSPKM).m_hd_chain.seed_id);
        if (bVar2) {
          local_88._16_8_ = 0;
          local_88._0_8_ = 0;
          local_88._8_8_ = 0;
          if (local_f8.has_key_origin == true) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_88._M_first,
                       &local_f8.key_origin.path);
          }
          else {
            bVar2 = ParseHDKeypath(&local_f8.hdKeypath,
                                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                   &local_88._M_first);
            if (!bVar2) {
              ScriptPubKeyMan::WalletLogPrintf<char[20],std::__cxx11::string>
                        ((ScriptPubKeyMan *)this,(ConstevalFormatString<2U>)0x3f81ad,
                         (char (*) [20])"MarkUnusedAddresses",&local_f8.hdKeypath);
            }
          }
          if (local_88._8_8_ - local_88._0_8_ == 0xc) {
            seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[8] =
                 local_f8.hd_seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[8];
            seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[9] =
                 local_f8.hd_seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[9];
            seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[10] =
                 local_f8.hd_seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[10];
            seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[0xb] =
                 local_f8.hd_seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[0xb];
            seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[0xc] =
                 local_f8.hd_seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[0xc];
            seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[0xd] =
                 local_f8.hd_seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[0xd];
            seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[0xe] =
                 local_f8.hd_seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[0xe];
            seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[0xf] =
                 local_f8.hd_seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[0xf];
            seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[0] =
                 local_f8.hd_seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[0];
            seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[1] =
                 local_f8.hd_seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[1];
            seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[2] =
                 local_f8.hd_seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[2];
            seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[3] =
                 local_f8.hd_seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[3];
            seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[4] =
                 local_f8.hd_seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[4];
            seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[5] =
                 local_f8.hd_seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[5];
            seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[6] =
                 local_f8.hd_seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[6];
            seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[7] =
                 local_f8.hd_seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[7];
            seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[0x10] =
                 local_f8.hd_seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[0x10];
            seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[0x11] =
                 local_f8.hd_seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[0x11];
            seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[0x12] =
                 local_f8.hd_seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[0x12];
            seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[0x13] =
                 local_f8.hd_seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[0x13];
            bVar2 = TopUpInactiveHDChain
                              (this,seed_id,(ulong)(*(uint *)(local_88._0_8_ + 8) & 0x7fffffff),
                               (*(uint *)(local_88._0_8_ + 4) & 0x7fffffff) != 0);
            if (!bVar2) {
              ScriptPubKeyMan::WalletLogPrintf<char[20]>
                        ((ScriptPubKeyMan *)this,(ConstevalFormatString<1U>)0x3f823b,
                         (char (*) [20])"MarkUnusedAddresses");
            }
          }
          else {
            local_138._M_impl.super__Vector_impl_data._M_start =
                 (pointer)((long)(local_88._8_8_ - local_88._0_8_) >> 2);
            ScriptPubKeyMan::WalletLogPrintf<char[20],unsigned_long,bool>
                      ((ScriptPubKeyMan *)this,(ConstevalFormatString<3U>)0x3f81ea,
                       (char (*) [20])"MarkUnusedAddresses",(unsigned_long *)&local_138,
                       &local_f8.has_key_origin);
          }
          std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                    ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_88._M_first
                    );
        }
      }
      CKeyMetadata::~CKeyMetadata(&local_f8);
    }
  }
  std::_Vector_base<CKeyID,_std::allocator<CKeyID>_>::~_Vector_base(&local_120);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_108);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<WalletDestination> LegacyScriptPubKeyMan::MarkUnusedAddresses(const CScript& script)
{
    LOCK(cs_KeyStore);
    std::vector<WalletDestination> result;
    // extract addresses and check if they match with an unused keypool key
    for (const auto& keyid : GetAffectedKeys(script, *this)) {
        std::map<CKeyID, int64_t>::const_iterator mi = m_pool_key_to_index.find(keyid);
        if (mi != m_pool_key_to_index.end()) {
            WalletLogPrintf("%s: Detected a used keypool key, mark all keypool keys up to this key as used\n", __func__);
            for (const auto& keypool : MarkReserveKeysAsUsed(mi->second)) {
                // derive all possible destinations as any of them could have been used
                for (const auto& type : LEGACY_OUTPUT_TYPES) {
                    const auto& dest = GetDestinationForKey(keypool.vchPubKey, type);
                    result.push_back({dest, keypool.fInternal});
                }
            }

            if (!TopUp()) {
                WalletLogPrintf("%s: Topping up keypool failed (locked wallet)\n", __func__);
            }
        }

        // Find the key's metadata and check if it's seed id (if it has one) is inactive, i.e. it is not the current m_hd_chain seed id.
        // If so, TopUp the inactive hd chain
        auto it = mapKeyMetadata.find(keyid);
        if (it != mapKeyMetadata.end()){
            CKeyMetadata meta = it->second;
            if (!meta.hd_seed_id.IsNull() && meta.hd_seed_id != m_hd_chain.seed_id) {
                std::vector<uint32_t> path;
                if (meta.has_key_origin) {
                    path = meta.key_origin.path;
                } else if (!ParseHDKeypath(meta.hdKeypath, path)) {
                    WalletLogPrintf("%s: Adding inactive seed keys failed, invalid hdKeypath: %s\n",
                                    __func__,
                                    meta.hdKeypath);
                }
                if (path.size() != 3) {
                    WalletLogPrintf("%s: Adding inactive seed keys failed, invalid path size: %d, has_key_origin: %s\n",
                                    __func__,
                                    path.size(),
                                    meta.has_key_origin);
                } else {
                    bool internal = (path[1] & ~BIP32_HARDENED_KEY_LIMIT) != 0;
                    int64_t index = path[2] & ~BIP32_HARDENED_KEY_LIMIT;

                    if (!TopUpInactiveHDChain(meta.hd_seed_id, index, internal)) {
                        WalletLogPrintf("%s: Adding inactive seed keys failed\n", __func__);
                    }
                }
            }
        }
    }

    return result;
}